

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_m44f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_attr_m44f_t *peVar1;
  exr_result_t eVar2;
  int32_t isz;
  exr_attr_m44f_t tmp;
  undefined4 local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  peVar1 = (a->field_6).m44f;
  local_58 = peVar1->m[0];
  fStack_54 = peVar1->m[1];
  fStack_50 = peVar1->m[2];
  fStack_4c = peVar1->m[3];
  local_48 = peVar1->m[4];
  fStack_44 = peVar1->m[5];
  fStack_40 = peVar1->m[6];
  fStack_3c = peVar1->m[7];
  local_38 = peVar1->m[8];
  fStack_34 = peVar1->m[9];
  fStack_30 = peVar1->m[10];
  fStack_2c = peVar1->m[0xb];
  local_28 = peVar1->m[0xc];
  fStack_24 = peVar1->m[0xd];
  fStack_20 = peVar1->m[0xe];
  fStack_1c = peVar1->m[0xf];
  local_5c = 0x40;
  eVar2 = (*ctxt->do_write)(ctxt,&local_5c,4,&ctxt->output_file_offset);
  if (eVar2 == 0) {
    eVar2 = (*ctxt->do_write)(ctxt,&local_58,0x40,&ctxt->output_file_offset);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_m44f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m44f_t tmp = *(a->m44f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m44f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 16);
    return rv;
}